

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall CTxMemPool::removeConflicts(CTxMemPool *this,CTransaction *tx)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  CTransaction *txConflict;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  iterator it;
  const_iterator __end1;
  const_iterator __begin1;
  MemPoolRemovalReason in_stack_00000054;
  CTransaction *in_stack_00000058;
  CTxMemPool *in_stack_00000060;
  CTransaction *in_stack_ffffffffffffffb0;
  CTxMemPool *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
             (int)((ulong)in_RDI >> 0x20),(AnnotatedMixin<std::recursive_mutex> *)0x764ab5);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin(&in_stack_ffffffffffffffb0->vin);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end(&in_stack_ffffffffffffffb0->vin);
  while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                           ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_ffffffffffffffb8,
                            (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_ffffffffffffffb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb8 =
         (CTxMemPool *)
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   in_RDI);
    indirectmap<COutPoint,_const_CTransaction_*>::find
              ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_ffffffffffffffb8,
               (COutPoint *)in_stack_ffffffffffffffb0);
    indirectmap<COutPoint,_const_CTransaction_*>::end
              ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_ffffffffffffffb0);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffffb8,(_Self *)in_stack_ffffffffffffffb0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_COutPoint_*const,_const_CTransaction_*>_>
                           *)in_RDI);
      in_stack_ffffffffffffffb0 = ppVar3->second;
      bVar2 = ::operator!=((CTransaction *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (bVar2) {
        CTransaction::GetHash(in_RDI);
        transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)in_RDI);
        ClearPrioritisation(in_stack_ffffffffffffffb8,(uint256 *)in_stack_ffffffffffffffb0);
        removeRecursive(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      }
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::removeConflicts(const CTransaction &tx)
{
    // Remove transactions which depend on inputs of tx, recursively
    AssertLockHeld(cs);
    for (const CTxIn &txin : tx.vin) {
        auto it = mapNextTx.find(txin.prevout);
        if (it != mapNextTx.end()) {
            const CTransaction &txConflict = *it->second;
            if (txConflict != tx)
            {
                ClearPrioritisation(txConflict.GetHash());
                removeRecursive(txConflict, MemPoolRemovalReason::CONFLICT);
            }
        }
    }
}